

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

string * __thiscall
wasm::Pass::getArgumentOrDefault
          (string *__return_storage_ptr__,Pass *this,string *key,string *defaultValue)

{
  PassRunner *pPVar1;
  __type_conflict _Var2;
  string local_68;
  string local_48;
  
  _Var2 = std::operator==(key,&this->name);
  if (_Var2) {
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
              (__return_storage_ptr__,(optional<std::__cxx11::string> *)&this->passArg,defaultValue)
    ;
  }
  else {
    pPVar1 = this->runner;
    std::__cxx11::string::string((string *)&local_68,(string *)key);
    std::__cxx11::string::string((string *)&local_48,(string *)defaultValue);
    PassOptions::getArgumentOrDefault(__return_storage_ptr__,&pPVar1->options,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgumentOrDefault(const std::string& key,
                                       const std::string& defaultValue) {
  if (key == name) {
    return passArg.value_or(defaultValue);
  }

  return getPassOptions().getArgumentOrDefault(key, defaultValue);
}